

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFramebufferBlitTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles3::Functional::BlitNearestFilterConsistencyCase::compare
          (BlitNearestFilterConsistencyCase *this,Surface *reference,Surface *result)

{
  ostringstream *poVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  uint uVar4;
  ChannelOrder CVar5;
  bool bVar6;
  RenderTarget *pRVar7;
  ostream *poVar8;
  TestLog *pTVar9;
  uint uVar10;
  RGBA thr;
  int iVar11;
  Surface *pSVar12;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  bool bVar13;
  byte bVar14;
  ChannelOrder CVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  difference_type __n;
  ulong uVar23;
  int iVar24;
  RGBA cellColorA;
  RGBA cellColorB;
  Surface errorMask;
  vector<bool,_std::allocator<bool>_> verticalSign;
  vector<bool,_std::allocator<bool>_> horisontalSign;
  bool local_48d;
  uint local_484;
  RGBA local_480;
  uint local_47c;
  int local_478;
  RGBA local_474;
  undefined8 local_470;
  Surface *local_468;
  uint local_45c;
  ulong local_458;
  string local_450;
  string local_430;
  string local_410;
  BlitNearestFilterConsistencyCase *local_3f0;
  string local_3e8;
  Surface local_3c8;
  ulong local_3b0;
  uint local_3a4;
  vector<bool,_std::allocator<bool>_> local_3a0;
  vector<bool,_std::allocator<bool>_> local_378;
  string local_350;
  string local_330;
  LogImageSet local_310;
  LogImage local_2d0;
  LogImage local_240;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  tcu::RGBA::RGBA(&local_480,&(this->super_BlitRectCase).m_gridCellColorA);
  tcu::RGBA::RGBA(&local_474,&(this->super_BlitRectCase).m_gridCellColorB);
  pRVar7 = Context::getRenderTarget
                     ((this->super_BlitRectCase).super_FboTestCase.super_TestCase.m_context);
  iVar22 = (pRVar7->m_pixelFormat).alphaBits;
  uVar20 = 0x1000000 << (8U - (char)iVar22 & 0x1f);
  bVar14 = 8 - (char)(pRVar7->m_pixelFormat).redBits;
  if (iVar22 < 1) {
    uVar20 = 0;
  }
  uVar19 = 0x100 << (8U - (char)(pRVar7->m_pixelFormat).greenBits & 0x1f) | 1 << (bVar14 & 0x1f);
  uVar20 = 0x10000 << (8U - (char)(pRVar7->m_pixelFormat).blueBits & 0x1f) | uVar19 | uVar20;
  uVar18 = 1 << (bVar14 & 0x1f) & 0xff;
  if (0xf7 < uVar18) {
    uVar18 = 0xf8;
  }
  uVar19 = uVar19 >> 8 & 0xff;
  if (0xf7 < uVar19) {
    uVar19 = 0xf8;
  }
  uVar10 = uVar20 >> 0x10 & 0xff;
  if (0xf7 < uVar10) {
    uVar10 = 0xf8;
  }
  uVar20 = uVar20 >> 0x18;
  if (0xf7 < uVar20) {
    uVar20 = 0xf8;
  }
  iVar22 = (this->super_BlitRectCase).m_dstRect.m_data[2];
  iVar24 = (this->super_BlitRectCase).m_dstRect.m_data[0];
  uVar21 = (this->super_BlitRectCase).m_dstRect.m_data[1];
  uVar3 = (this->super_BlitRectCase).m_dstRect.m_data[3];
  uVar4 = uVar3;
  if ((int)uVar21 < (int)uVar3) {
    uVar4 = uVar21;
  }
  if ((int)uVar3 < (int)uVar21) {
    uVar3 = uVar21;
  }
  iVar16 = iVar22;
  if (iVar24 < iVar22) {
    iVar16 = iVar24;
  }
  iVar17 = result->m_width;
  if (iVar22 < iVar24) {
    iVar22 = iVar24;
  }
  local_478 = iVar17;
  if (iVar16 < iVar17) {
    local_478 = iVar16;
  }
  uVar21 = result->m_height;
  if (iVar16 < 0) {
    local_478 = 0;
  }
  local_484 = uVar21;
  if ((int)uVar4 < (int)uVar21) {
    local_484 = uVar4;
  }
  if ((int)uVar4 < 0) {
    local_484 = 0;
  }
  iVar24 = iVar17;
  if (iVar22 < iVar17) {
    iVar24 = iVar22;
  }
  if (iVar22 < 0) {
    iVar24 = 0;
  }
  if ((int)uVar3 < (int)uVar21) {
    uVar21 = uVar3;
  }
  thr.m_value = (uVar10 << 0x10 | uVar19 << 8 | uVar18) + uVar20 * 0x1000000 + 0x7070707;
  if ((int)uVar3 < 0) {
    uVar21 = 0;
  }
  uVar20 = *(uint *)((long)(result->m_pixels).m_ptr +
                    (long)(int)(iVar17 * local_484 + local_478) * 4);
  local_48d = true;
  if (uVar20 != local_480.m_value) {
    CVar15 = (uVar20 & 0xff) - (local_480.m_value & 0xff);
    CVar5 = -CVar15;
    if (0 < (int)CVar15) {
      CVar5 = CVar15;
    }
    iVar16 = (uVar20 >> 8 & 0xff) - (local_480.m_value >> 8 & 0xff);
    iVar22 = -iVar16;
    if (0 < iVar16) {
      iVar22 = iVar16;
    }
    iVar17 = (uVar20 >> 0x10 & 0xff) - (local_480.m_value >> 0x10 & 0xff);
    iVar16 = -iVar17;
    if (0 < iVar17) {
      iVar16 = iVar17;
    }
    iVar11 = (uVar20 >> 0x18) - (local_480.m_value >> 0x18);
    iVar17 = -iVar11;
    if (0 < iVar11) {
      iVar17 = iVar11;
    }
    local_1b0._0_4_ = iVar16 << 0x10 | iVar22 << 8 | iVar17 << 0x18 | CVar5;
    local_48d = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,thr);
  }
  tcu::Surface::Surface(&local_3c8,result->m_width,result->m_height);
  local_45c = iVar24 - local_478;
  local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_378,(long)(int)local_45c,(bool *)local_1b0,(allocator_type *)&local_2d0);
  local_47c = uVar21 - local_484;
  local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_3a0,(long)(int)local_47c,(bool *)local_1b0,(allocator_type *)&local_2d0);
  local_2d0.m_name._M_dataplus._M_p = (pointer)0x300000008;
  if ((void *)local_3c8.m_pixels.m_cap != (void *)0x0) {
    local_3c8.m_pixels.m_cap = (size_t)local_3c8.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_2d0,local_3c8.m_width,
             local_3c8.m_height,1,(void *)local_3c8.m_pixels.m_cap);
  local_2d0.m_name._M_dataplus._M_p = (pointer)0x3f80000000000000;
  local_2d0.m_name._M_string_length = 0x3f80000000000000;
  tcu::clear((PixelBufferAccess *)local_1b0,(Vec4 *)&local_2d0);
  local_1b0._0_8_ =
       ((this->super_BlitRectCase).super_FboTestCase.super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_3f0 = this;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Verifying consistency of NEAREST filtering. Verifying rect ",0x3b);
  tcu::operator<<((ostream *)poVar1,&(local_3f0->super_BlitRectCase).m_dstRect);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Rounding direction of the NEAREST filter at the horisontal texel edge (x = n + 0.5) should not depend on the y-coordinate.\n"
             ,0x7b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Rounding direction of the NEAREST filter at the vertical texel edge (y = n + 0.5) should not depend on the x-coordinate.\n"
             ,0x79);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Blitting a grid (with uniform sized cells) should result in a grid (with non-uniform sized cells)."
             ,0x62);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  uVar20 = 0;
  local_468 = result;
  if ((int)local_47c < 1) {
    bVar13 = false;
  }
  else {
    bVar13 = false;
    local_470 = (Surface *)CONCAT44(local_470._4_4_,iVar24);
    uVar18 = local_484;
    do {
      local_3b0 = CONCAT44(local_3b0._4_4_,uVar20);
      local_458 = CONCAT44(local_458._4_4_,uVar18);
      iVar22 = local_478;
      if (0 < (int)local_45c) {
        do {
          uVar20 = *(uint *)((long)(result->m_pixels).m_ptr +
                            (long)(int)(result->m_width * uVar18 + iVar22) * 4);
          if (uVar20 != local_480.m_value) {
            CVar15 = (uVar20 & 0xff) - (local_480.m_value & 0xff);
            CVar5 = -CVar15;
            if (0 < (int)CVar15) {
              CVar5 = CVar15;
            }
            uVar18 = uVar20 >> 8 & 0xff;
            iVar16 = uVar18 - (local_480.m_value >> 8 & 0xff);
            iVar24 = -iVar16;
            if (0 < iVar16) {
              iVar24 = iVar16;
            }
            uVar19 = uVar20 >> 0x10 & 0xff;
            iVar17 = uVar19 - (local_480.m_value >> 0x10 & 0xff);
            iVar16 = -iVar17;
            if (0 < iVar17) {
              iVar16 = iVar17;
            }
            iVar11 = (uVar20 >> 0x18) - (local_480.m_value >> 0x18);
            iVar17 = -iVar11;
            if (0 < iVar11) {
              iVar17 = iVar11;
            }
            local_1b0._0_4_ = iVar16 << 0x10 | iVar24 << 8 | iVar17 << 0x18 | CVar5;
            bVar6 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,thr);
            if ((bVar6) || (uVar20 == local_474.m_value)) {
              result = local_468;
              uVar18 = (uint)local_458;
              iVar24 = (int)local_470;
            }
            else {
              CVar15 = (uVar20 & 0xff) - (local_474.m_value & 0xff);
              CVar5 = -CVar15;
              if (0 < (int)CVar15) {
                CVar5 = CVar15;
              }
              iVar16 = uVar18 - (local_474.m_value >> 8 & 0xff);
              iVar24 = -iVar16;
              if (0 < iVar16) {
                iVar24 = iVar16;
              }
              iVar17 = uVar19 - (local_474.m_value >> 0x10 & 0xff);
              iVar16 = -iVar17;
              if (0 < iVar17) {
                iVar16 = iVar17;
              }
              iVar11 = (uVar20 >> 0x18) - (local_474.m_value >> 0x18);
              iVar17 = -iVar11;
              if (0 < iVar11) {
                iVar17 = iVar11;
              }
              local_1b0._0_4_ = iVar16 << 0x10 | iVar24 << 8 | iVar17 << 0x18 | CVar5;
              bVar6 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,thr);
              result = local_468;
              uVar18 = (uint)local_458;
              iVar24 = (int)local_470;
              if (!bVar6) {
                *(undefined4 *)
                 ((long)local_3c8.m_pixels.m_ptr +
                 (long)(int)(local_3c8.m_width * (uint)local_458 + iVar22) * 4) = 0xff0000ff;
                bVar13 = true;
              }
            }
          }
          iVar22 = iVar22 + 1;
        } while (iVar24 != iVar22);
      }
      uVar20 = (int)local_3b0 + 1;
      uVar18 = uVar18 + 1;
    } while (uVar20 != local_47c);
  }
  iVar22 = local_478;
  if (bVar13) {
    local_1b0._0_8_ =
         ((local_3f0->super_BlitRectCase).super_FboTestCase.super_TestCase.super_TestCase.
          super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Image verification failed, destination rect contains unexpected values. ",0x48);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Expected either ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"RGBA(",5);
    poVar8 = (ostream *)std::ostream::operator<<(poVar1,local_480.m_value & 0xff);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_480.m_value >> 8 & 0xff);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_480.m_value >> 0x10 & 0xff);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_480.m_value >> 0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," or ",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"RGBA(",5);
    poVar8 = (ostream *)std::ostream::operator<<(poVar1,local_474.m_value & 0xff);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_474.m_value >> 8 & 0xff);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_474.m_value >> 0x10 & 0xff);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_474.m_value >> 0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".",1);
    pTVar9 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"Result","");
    local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_430,"Image verification result","");
    tcu::LogImageSet::LogImageSet(&local_310,&local_410,&local_430);
    tcu::TestLog::startImageSet
              (pTVar9,local_310.m_name._M_dataplus._M_p,local_310.m_description._M_dataplus._M_p);
    local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"Result","");
    local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"Result","");
    tcu::LogImage::LogImage(&local_2d0,&local_450,&local_3e8,result,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_2d0,(int)pTVar9,__buf,(size_t)result);
    local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"ErrorMask","");
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"Error mask","");
    pSVar12 = &local_3c8;
    tcu::LogImage::LogImage(&local_240,&local_330,&local_350,pSVar12,QP_IMAGE_COMPRESSION_MODE_BEST)
    ;
    tcu::LogImage::write(&local_240,(int)pTVar9,__buf_00,(size_t)pSVar12);
    tcu::TestLog::endImageSet(pTVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_description._M_dataplus._M_p != &local_240.m_description.field_2) {
      operator_delete(local_240.m_description._M_dataplus._M_p,
                      local_240.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_name._M_dataplus._M_p != &local_240.m_name.field_2) {
      operator_delete(local_240.m_name._M_dataplus._M_p,
                      local_240.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0.m_description._M_dataplus._M_p != &local_2d0.m_description.field_2) {
      operator_delete(local_2d0.m_description._M_dataplus._M_p,
                      local_2d0.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0.m_name._M_dataplus._M_p != &local_2d0.m_name.field_2) {
      operator_delete(local_2d0.m_name._M_dataplus._M_p,
                      local_2d0.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
      operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310.m_description._M_dataplus._M_p != &local_310.m_description.field_2) {
      operator_delete(local_310.m_description._M_dataplus._M_p,
                      local_310.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310.m_name._M_dataplus._M_p != &local_310.m_name.field_2) {
      operator_delete(local_310.m_name._M_dataplus._M_p,
                      local_310.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2) {
      operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base(local_138);
    bVar13 = false;
  }
  else {
    local_458 = (ulong)local_45c;
    if (0 < (int)local_45c) {
      uVar23 = 0;
      do {
        uVar20 = *(uint *)((long)(result->m_pixels).m_ptr +
                          (long)(int)(result->m_width * local_484 + iVar22 + (int)uVar23) * 4);
        if (uVar20 == local_480.m_value) {
LAB_012eaf5c:
          local_378.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p[uVar23 >> 6] =
               local_378.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_p[uVar23 >> 6] | 1L << ((byte)uVar23 & 0x3f);
        }
        else {
          local_470 = (Surface *)(CONCAT44(local_470._4_4_,uVar20) & 0xffffffff000000ff);
          CVar15 = (uVar20 & 0xff) - (local_480.m_value & 0xff);
          CVar5 = -CVar15;
          if (0 < (int)CVar15) {
            CVar5 = CVar15;
          }
          uVar18 = uVar20 >> 8 & 0xff;
          iVar16 = uVar18 - (local_480.m_value >> 8 & 0xff);
          iVar24 = -iVar16;
          if (0 < iVar16) {
            iVar24 = iVar16;
          }
          uVar19 = uVar20 >> 0x10 & 0xff;
          iVar17 = uVar19 - (local_480.m_value >> 0x10 & 0xff);
          iVar16 = -iVar17;
          if (0 < iVar17) {
            iVar16 = iVar17;
          }
          iVar11 = (uVar20 >> 0x18) - (local_480.m_value >> 0x18);
          iVar17 = -iVar11;
          if (0 < iVar11) {
            iVar17 = iVar11;
          }
          local_1b0._0_4_ = iVar16 << 0x10 | iVar24 << 8 | iVar17 << 0x18 | CVar5;
          bVar6 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,thr);
          if (bVar6) goto LAB_012eaf5c;
          if (uVar20 == local_474.m_value) {
LAB_012eb00f:
            bVar14 = (byte)uVar23 & 0x3f;
            local_378.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[uVar23 >> 6] =
                 local_378.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar23 >> 6] &
                 (-2L << bVar14 | 0xfffffffffffffffeU >> 0x40 - bVar14);
          }
          else {
            CVar15 = (int)local_470 - (local_474.m_value & 0xff);
            CVar5 = -CVar15;
            if (0 < (int)CVar15) {
              CVar5 = CVar15;
            }
            iVar16 = uVar18 - (local_474.m_value >> 8 & 0xff);
            iVar24 = -iVar16;
            if (0 < iVar16) {
              iVar24 = iVar16;
            }
            iVar17 = uVar19 - (local_474.m_value >> 0x10 & 0xff);
            iVar16 = -iVar17;
            if (0 < iVar17) {
              iVar16 = iVar17;
            }
            iVar11 = (uVar20 >> 0x18) - (local_474.m_value >> 0x18);
            iVar17 = -iVar11;
            if (0 < iVar11) {
              iVar17 = iVar11;
            }
            local_1b0._0_4_ = iVar16 << 0x10 | iVar24 << 8 | iVar17 << 0x18 | CVar5;
            bVar6 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,thr);
            if (bVar6) goto LAB_012eb00f;
          }
        }
        uVar23 = uVar23 + 1;
        result = local_468;
      } while (local_458 != uVar23);
    }
    local_470 = (Surface *)(ulong)local_47c;
    if (0 < (int)local_47c) {
      local_3b0 = (ulong)local_484;
      pSVar12 = (Surface *)0x0;
      do {
        uVar20 = *(uint *)((long)(result->m_pixels).m_ptr +
                          (long)(((int)local_3b0 + (int)pSVar12) * result->m_width + local_478) * 4)
        ;
        if (uVar20 == local_480.m_value) {
LAB_012eb113:
          local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p[(ulong)pSVar12 >> 6] =
               local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_p[(ulong)pSVar12 >> 6] |
               1L << ((byte)pSVar12 & 0x3f);
        }
        else {
          local_3a4 = uVar20 & 0xff;
          CVar15 = local_3a4 - (local_480.m_value & 0xff);
          CVar5 = -CVar15;
          if (0 < (int)CVar15) {
            CVar5 = CVar15;
          }
          uVar18 = uVar20 >> 8 & 0xff;
          iVar16 = uVar18 - (local_480.m_value >> 8 & 0xff);
          iVar24 = -iVar16;
          if (0 < iVar16) {
            iVar24 = iVar16;
          }
          uVar19 = uVar20 >> 0x10 & 0xff;
          iVar17 = uVar19 - (local_480.m_value >> 0x10 & 0xff);
          iVar16 = -iVar17;
          if (0 < iVar17) {
            iVar16 = iVar17;
          }
          iVar11 = (uVar20 >> 0x18) - (local_480.m_value >> 0x18);
          iVar17 = -iVar11;
          if (0 < iVar11) {
            iVar17 = iVar11;
          }
          local_1b0._0_4_ = iVar16 << 0x10 | iVar24 << 8 | iVar17 << 0x18 | CVar5;
          bVar6 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,thr);
          if (bVar6) goto LAB_012eb113;
          if (uVar20 == local_474.m_value) {
LAB_012eb1c9:
            bVar14 = (byte)pSVar12 & 0x3f;
            local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[(ulong)pSVar12 >> 6] =
                 local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [(ulong)pSVar12 >> 6] & (-2L << bVar14 | 0xfffffffffffffffeU >> 0x40 - bVar14);
          }
          else {
            CVar15 = local_3a4 - (local_474.m_value & 0xff);
            CVar5 = -CVar15;
            if (0 < (int)CVar15) {
              CVar5 = CVar15;
            }
            iVar16 = uVar18 - (local_474.m_value >> 8 & 0xff);
            iVar24 = -iVar16;
            if (0 < iVar16) {
              iVar24 = iVar16;
            }
            iVar17 = uVar19 - (local_474.m_value >> 0x10 & 0xff);
            iVar16 = -iVar17;
            if (0 < iVar17) {
              iVar16 = iVar17;
            }
            iVar11 = (uVar20 >> 0x18) - (local_474.m_value >> 0x18);
            iVar17 = -iVar11;
            if (0 < iVar11) {
              iVar17 = iVar11;
            }
            local_1b0._0_4_ = iVar16 << 0x10 | iVar24 << 8 | iVar17 << 0x18 | CVar5;
            bVar6 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,thr);
            if (bVar6) goto LAB_012eb1c9;
          }
        }
        pSVar12 = (Surface *)((long)&pSVar12->m_width + 1);
        result = local_468;
      } while (local_470 != pSVar12);
    }
    if (0 < (int)local_47c) {
      pSVar12 = (Surface *)0x0;
      do {
        local_468 = pSVar12;
        if (0 < (int)local_45c) {
          uVar23 = 0;
          do {
            uVar20 = *(uint *)((long)(result->m_pixels).m_ptr +
                              (long)(int)(result->m_width * local_484 + iVar22 + (int)uVar23) * 4);
            bVar6 = true;
            if (local_480.m_value != uVar20) {
              CVar15 = (local_480.m_value & 0xff) - (uVar20 & 0xff);
              CVar5 = -CVar15;
              if (0 < (int)CVar15) {
                CVar5 = CVar15;
              }
              iVar16 = (local_480.m_value >> 8 & 0xff) - (uVar20 >> 8 & 0xff);
              iVar24 = -iVar16;
              if (0 < iVar16) {
                iVar24 = iVar16;
              }
              iVar17 = (local_480.m_value >> 0x10 & 0xff) - (uVar20 >> 0x10 & 0xff);
              iVar16 = -iVar17;
              if (0 < iVar17) {
                iVar16 = iVar17;
              }
              iVar11 = (local_480.m_value >> 0x18) - (uVar20 >> 0x18);
              iVar17 = -iVar11;
              if (0 < iVar11) {
                iVar17 = iVar11;
              }
              local_1b0._0_4_ = iVar16 << 0x10 | iVar24 << 8 | iVar17 << 0x18 | CVar5;
              bVar6 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,thr);
            }
            if (bVar6 == (bool)(((local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                  [(ulong)pSVar12 >> 6] & 1L << ((byte)pSVar12 & 0x3f)) == 0) !=
                                ((local_378.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                  [uVar23 >> 6] >> (uVar23 & 0x3f) & 1) != 0) ^ local_48d)) {
              *(undefined4 *)
               ((long)local_3c8.m_pixels.m_ptr +
               (long)(int)(local_3c8.m_width * local_484 + iVar22 + (int)uVar23) * 4) = 0xff0000ff;
              bVar13 = true;
            }
            uVar23 = uVar23 + 1;
          } while (local_458 != uVar23);
        }
        pSVar12 = (Surface *)((long)&local_468->m_width + 1);
        local_484 = local_484 + 1;
      } while (pSVar12 != local_470);
    }
    if (bVar13 == false) {
      local_1b0._0_8_ =
           ((local_3f0->super_BlitRectCase).super_FboTestCase.super_TestCase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),"Image verification passed.",0x1a);
      pTVar9 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      paVar2 = &local_310.m_name.field_2;
      local_310.m_name._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"Result","");
      local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_410,"Image verification result","");
      tcu::LogImageSet::LogImageSet((LogImageSet *)&local_240,&local_310.m_name,&local_410);
      tcu::TestLog::startImageSet
                (pTVar9,local_240.m_name._M_dataplus._M_p,local_240.m_description._M_dataplus._M_p);
      local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"Result","");
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"Result","");
      tcu::LogImage::LogImage
                (&local_2d0,&local_430,&local_450,result,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_2d0,(int)pTVar9,__buf_03,(size_t)result);
      tcu::TestLog::endImageSet(pTVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0.m_description._M_dataplus._M_p != &local_2d0.m_description.field_2) {
        operator_delete(local_2d0.m_description._M_dataplus._M_p,
                        local_2d0.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0.m_name._M_dataplus._M_p != &local_2d0.m_name.field_2) {
        operator_delete(local_2d0.m_name._M_dataplus._M_p,
                        local_2d0.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_dataplus._M_p != &local_430.field_2) {
        operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240.m_description._M_dataplus._M_p != &local_240.m_description.field_2) {
        operator_delete(local_240.m_description._M_dataplus._M_p,
                        local_240.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240.m_name._M_dataplus._M_p != &local_240.m_name.field_2) {
        operator_delete(local_240.m_name._M_dataplus._M_p,
                        local_240.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_dataplus._M_p != &local_410.field_2) {
        operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310.m_name._M_dataplus._M_p != paVar2) {
        operator_delete(local_310.m_name._M_dataplus._M_p,
                        local_310.m_name.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_1b0._0_8_ =
           ((local_3f0->super_BlitRectCase).super_FboTestCase.super_TestCase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),
                 "Image verification failed, nearest filter is not consistent.",0x3c);
      pTVar9 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"Result","");
      local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_430,"Image verification result","");
      tcu::LogImageSet::LogImageSet(&local_310,&local_410,&local_430);
      tcu::TestLog::startImageSet
                (pTVar9,local_310.m_name._M_dataplus._M_p,local_310.m_description._M_dataplus._M_p);
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"Result","");
      local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"Result","");
      tcu::LogImage::LogImage
                (&local_2d0,&local_450,&local_3e8,result,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_2d0,(int)pTVar9,__buf_01,(size_t)result);
      local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"ErrorMask","");
      local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"Error mask","");
      pSVar12 = &local_3c8;
      tcu::LogImage::LogImage
                (&local_240,&local_330,&local_350,pSVar12,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_240,(int)pTVar9,__buf_02,(size_t)pSVar12);
      tcu::TestLog::endImageSet(pTVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240.m_description._M_dataplus._M_p != &local_240.m_description.field_2) {
        operator_delete(local_240.m_description._M_dataplus._M_p,
                        local_240.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240.m_name._M_dataplus._M_p != &local_240.m_name.field_2) {
        operator_delete(local_240.m_name._M_dataplus._M_p,
                        local_240.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p != &local_350.field_2) {
        operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != &local_330.field_2) {
        operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0.m_description._M_dataplus._M_p != &local_2d0.m_description.field_2) {
        operator_delete(local_2d0.m_description._M_dataplus._M_p,
                        local_2d0.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0.m_name._M_dataplus._M_p != &local_2d0.m_name.field_2) {
        operator_delete(local_2d0.m_name._M_dataplus._M_p,
                        local_2d0.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
        operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310.m_description._M_dataplus._M_p != &local_310.m_description.field_2) {
        operator_delete(local_310.m_description._M_dataplus._M_p,
                        local_310.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310.m_name._M_dataplus._M_p != &local_310.m_name.field_2) {
        operator_delete(local_310.m_name._M_dataplus._M_p,
                        local_310.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_dataplus._M_p != &local_430.field_2) {
        operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_dataplus._M_p != &local_410.field_2) {
        operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base(local_138);
    bVar13 = (bool)(bVar13 ^ 1);
  }
  if (local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_378.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_378.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_378.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_378.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_378.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_378.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_378.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_378.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_378.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  tcu::Surface::~Surface(&local_3c8);
  return bVar13;
}

Assistant:

bool BlitNearestFilterConsistencyCase::compare (const tcu::Surface& reference, const tcu::Surface& result)
{
	DE_ASSERT(reference.getWidth() == result.getWidth());
	DE_ASSERT(reference.getHeight() == result.getHeight());
	DE_UNREF(reference);

	// Image origin must be visible (for baseColor)
	DE_ASSERT(de::min(m_dstRect.x(), m_dstRect.z()) >= 0);
	DE_ASSERT(de::min(m_dstRect.y(), m_dstRect.w()) >= 0);

	const tcu::RGBA		cellColorA		(m_gridCellColorA);
	const tcu::RGBA		cellColorB		(m_gridCellColorB);
	const tcu::RGBA		threshold		= TestCase::m_context.getRenderTarget().getPixelFormat().getColorThreshold() + tcu::RGBA(7,7,7,7);
	const tcu::IVec4	destinationArea	= tcu::IVec4(de::clamp(de::min(m_dstRect.x(), m_dstRect.z()), 0, result.getWidth()),
													 de::clamp(de::min(m_dstRect.y(), m_dstRect.w()), 0, result.getHeight()),
													 de::clamp(de::max(m_dstRect.x(), m_dstRect.z()), 0, result.getWidth()),
													 de::clamp(de::max(m_dstRect.y(), m_dstRect.w()), 0, result.getHeight()));
	const tcu::RGBA		baseColor		= result.getPixel(destinationArea.x(), destinationArea.y());
	const bool			signConfig		= tcu::compareThreshold(baseColor, cellColorA, threshold);

	bool				error			= false;
	tcu::Surface		errorMask		(result.getWidth(), result.getHeight());
	std::vector<bool>	horisontalSign	(destinationArea.z() - destinationArea.x());
	std::vector<bool>	verticalSign	(destinationArea.w() - destinationArea.y());

	tcu::clear(errorMask.getAccess(), tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f));

	// Checking only area in our destination rect

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Verifying consistency of NEAREST filtering. Verifying rect " << m_dstRect << ".\n"
		<< "Rounding direction of the NEAREST filter at the horisontal texel edge (x = n + 0.5) should not depend on the y-coordinate.\n"
		<< "Rounding direction of the NEAREST filter at the vertical texel edge (y = n + 0.5) should not depend on the x-coordinate.\n"
		<< "Blitting a grid (with uniform sized cells) should result in a grid (with non-uniform sized cells)."
		<< tcu::TestLog::EndMessage;

	// Verify that destination only contains valid colors

	for (int dy = 0; dy < destinationArea.w() - destinationArea.y(); ++dy)
	for (int dx = 0; dx < destinationArea.z() - destinationArea.x(); ++dx)
	{
		const tcu::RGBA	color	= result.getPixel(destinationArea.x() + dx, destinationArea.y() + dy);
		const bool isValidColor = tcu::compareThreshold(color, cellColorA, threshold) || tcu::compareThreshold(color, cellColorB, threshold);

		if (!isValidColor)
		{
			errorMask.setPixel(destinationArea.x() + dx, destinationArea.y() + dy, tcu::RGBA::red());
			error = true;
		}
	}
	if (error)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Image verification failed, destination rect contains unexpected values. "
			<< "Expected either " << cellColorA << " or " << cellColorB << "."
			<< tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Result", "Image verification result")
			<< tcu::TestLog::Image("Result",	"Result",		result)
			<< tcu::TestLog::Image("ErrorMask",	"Error mask",	errorMask)
			<< tcu::TestLog::EndImageSet;
		return false;
	}

	// Detect result edges by reading the first row and first column of the blitted area.
	// Blitting a grid should result in a grid-like image. ("sign changes" should be consistent)

	for (int dx = 0; dx < destinationArea.z() - destinationArea.x(); ++dx)
	{
		const tcu::RGBA color = result.getPixel(destinationArea.x() + dx, destinationArea.y());

		if (tcu::compareThreshold(color, cellColorA, threshold))
			horisontalSign[dx] = true;
		else if (tcu::compareThreshold(color, cellColorB, threshold))
			horisontalSign[dx] = false;
		else
			DE_ASSERT(DE_FALSE);
	}
	for (int dy = 0; dy < destinationArea.w() - destinationArea.y(); ++dy)
	{
		const tcu::RGBA color = result.getPixel(destinationArea.x(), destinationArea.y() + dy);

		if (tcu::compareThreshold(color, cellColorA, threshold))
			verticalSign[dy] = true;
		else if (tcu::compareThreshold(color, cellColorB, threshold))
			verticalSign[dy] = false;
		else
			DE_ASSERT(DE_FALSE);
	}

	// Verify grid-like image

	for (int dy = 0; dy < destinationArea.w() - destinationArea.y(); ++dy)
	for (int dx = 0; dx < destinationArea.z() - destinationArea.x(); ++dx)
	{
		const tcu::RGBA	color		= result.getPixel(destinationArea.x() + dx, destinationArea.y() + dy);
		const bool		resultSign	= tcu::compareThreshold(cellColorA, color, threshold);
		const bool		correctSign	= (horisontalSign[dx] == verticalSign[dy]) == signConfig;

		if (resultSign != correctSign)
		{
			errorMask.setPixel(destinationArea.x() + dx, destinationArea.y() + dy, tcu::RGBA::red());
			error = true;
		}
	}

	// Report result

	if (error)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Image verification failed, nearest filter is not consistent."
			<< tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Result", "Image verification result")
			<< tcu::TestLog::Image("Result",	"Result",		result)
			<< tcu::TestLog::Image("ErrorMask",	"Error mask",	errorMask)
			<< tcu::TestLog::EndImageSet;
	}
	else
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Image verification passed."
			<< tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Result", "Image verification result")
			<< tcu::TestLog::Image("Result", "Result", result)
			<< tcu::TestLog::EndImageSet;
	}

	return !error;
}